

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O2

LatticePathWithScore * __thiscall
sentencepiece::unigram::Lattice::Viterbi(LatticePathWithScore *__return_storage_ptr__,Lattice *this)

{
  pointer pvVar1;
  pointer ppNVar2;
  Node *pNVar3;
  LatticePathWithScore *pLVar4;
  Node *pNVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ostream *poVar9;
  value_type *ppNVar10;
  ulong uVar11;
  value_type *__range4;
  pointer pvVar12;
  pointer ppNVar13;
  Node *pNVar14;
  pointer ppNVar15;
  float fVar16;
  float fVar17;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  results;
  LatticePathWithScore *retval;
  _Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  local_58;
  LatticePathWithScore *local_40;
  Node *local_38;
  
  pvVar1 = (this->begin_nodes_).
           super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (int)((ulong)((long)(this->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->surface_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3) - 1;
  uVar11 = 0;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  do {
    local_40 = __return_storage_ptr__;
    if (uVar11 == uVar6 + 1) {
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ppNVar10 = pvVar1[uVar6].
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      fVar16 = (*ppNVar10)->backtrace_score;
      while (local_38 = (*ppNVar10)->prev, local_38->prev != (Node *)0x0) {
        std::
        vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ::push_back((vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                     *)&local_58,&local_38);
        ppNVar10 = &local_38;
      }
      std::
      __reverse<__gnu_cxx::__normal_iterator<sentencepiece::unigram::Lattice::Node**,std::vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>>>
                (local_58._M_impl.super__Vector_impl_data._M_start,
                 local_58._M_impl.super__Vector_impl_data._M_finish);
      pLVar4 = local_40;
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::vector(&local_40->first,
               (vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                *)&local_58);
      pLVar4->second = fVar16;
      std::
      _Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::~_Vector_base(&local_58);
      return pLVar4;
    }
    ppNVar2 = *(pointer *)
               ((long)&pvVar1[uVar11].
                       super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    pvVar12 = (this->end_nodes_).
              super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar11;
    for (ppNVar13 = pvVar1[uVar11].
                    super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppNVar13 != ppNVar2;
        ppNVar13 = ppNVar13 + 1) {
      pNVar3 = *ppNVar13;
      pNVar3->prev = (Node *)0x0;
      fVar16 = 0.0;
      pNVar14 = (Node *)0x0;
      for (ppNVar15 = (pvVar12->
                      super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          ppNVar15 !=
          *(pointer *)
           ((long)&(pvVar12->
                   super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                   )._M_impl.super__Vector_impl_data + 8); ppNVar15 = ppNVar15 + 1) {
        fVar17 = (*ppNVar15)->backtrace_score + pNVar3->score;
        pNVar5 = *ppNVar15;
        if (fVar17 <= fVar16 && pNVar14 != (Node *)0x0) {
          fVar17 = fVar16;
          pNVar5 = pNVar14;
        }
        pNVar14 = pNVar5;
        fVar16 = fVar17;
      }
      if (pNVar14 == (Node *)0x0) {
        iVar7 = logging::GetMinLogLevel();
        if (iVar7 < 3) {
          local_58._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_start &
                        0xffffffffffffff00);
          pcVar8 = logging::BaseName("third_party/sentencepiece/src/unigram_model.cc");
          poVar9 = std::operator<<((ostream *)&std::cerr,pcVar8);
          poVar9 = std::operator<<(poVar9,"(");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0xb1);
          poVar9 = std::operator<<(poVar9,") ");
          poVar9 = std::operator<<(poVar9,"LOG(");
          poVar9 = std::operator<<(poVar9,"ERROR");
          poVar9 = std::operator<<(poVar9,") ");
          std::operator<<(poVar9,"Failed to find the best path in Viterbi.");
          error::Die::~Die((Die *)&local_58);
        }
        *(undefined8 *)
         ((long)&(local_40->first).
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
        *(undefined8 *)
         ((long)&(local_40->first).
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
        (local_40->first).
        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_40->first).
        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        return local_40;
      }
      pNVar3->prev = pNVar14;
      pNVar3->backtrace_score = fVar16;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

Lattice::LatticePathWithScore Lattice::Viterbi() {
  const int len = size();

  for (int pos = 0; pos <= len; ++pos) {
    for (Node *rnode : begin_nodes_[pos]) {
      rnode->prev = nullptr;
      float best_score = 0.0;
      Node *best_node = nullptr;
      for (Node *lnode : end_nodes_[pos]) {
        const float score = lnode->backtrace_score + rnode->score;
        if (best_node == nullptr || score > best_score) {
          best_node = lnode;
          best_score = score;
        }
      }
      if (best_node == nullptr) {
        LOG(ERROR) << "Failed to find the best path in Viterbi.";
        return {};
      }
      rnode->prev = best_node;
      rnode->backtrace_score = best_score;
    }
  }

  // backtrace
  std::vector<Node *> results;
  float score = begin_nodes(len)[0]->backtrace_score;
  for (Node *node = begin_nodes_[len][0]->prev; node->prev != nullptr;
       node = node->prev) {
    results.push_back(node);
  }

  std::reverse(results.begin(), results.end());

  LatticePathWithScore retval = {results, score};

  return retval;
}